

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * __thiscall
testing::PrintToString<unique_ptr<Struct2>>
          (string *__return_storage_ptr__,testing *this,unique_ptr<Struct2> *value)

{
  long in_FS_OFFSET;
  ostream *local_1c0;
  unique_ptr<Struct2> *value_local;
  stringstream local_198 [8];
  stringstream ss;
  ostream aoStack_188 [376];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_198);
  local_1c0 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x198) {
    local_1c0 = aoStack_188;
  }
  internal::UniversalTersePrinter<unique_ptr<Struct2>_>::Print
            ((unique_ptr<Struct2> *)this,local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}